

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool NumberTemp::IsTempProducing(Instr *instr)

{
  OpCode opcode;
  bool bVar1;
  ObjectType OVar2;
  undefined8 in_RAX;
  IndirOpnd *pIVar3;
  undefined8 uStack_28;
  ValueType baseValueType;
  
  opcode = instr->m_opcode;
  uStack_28 = in_RAX;
  bVar1 = OpCodeAttr::TempNumberProducing(opcode);
  if (bVar1) {
    return true;
  }
  if (opcode == LdElemI_A) {
    pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_src1);
    uStack_28 = CONCAT26((pIVar3->m_baseOpnd->super_Opnd).m_valueType.field_0.bits,
                         (undefined6)uStack_28);
    bVar1 = ValueType::IsLikelyObject((ValueType *)((long)&uStack_28 + 6));
    if (bVar1) {
      OVar2 = ValueType::GetObjectType((ValueType *)((long)&uStack_28 + 6));
      if (OVar2 == Float32Array) {
        return true;
      }
      OVar2 = ValueType::GetObjectType((ValueType *)((long)&uStack_28 + 6));
      if (OVar2 == Float64Array) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempProducing(IR::Instr * instr)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::TempNumberProducing(opcode))
    {
        return true;
    }

    // Loads from float typedArrays usually require a conversion to Var, which we can MarkTemp.
    if (opcode == Js::OpCode::LdElemI_A)
    {
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if (baseValueType.IsLikelyObject()
            && (baseValueType.GetObjectType() == ObjectType::Float32Array
            || baseValueType.GetObjectType() == ObjectType::Float64Array))
        {
            return true;
        }
    }

    return false;
}